

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

optional<unsigned_int>
wasm::String::anon_unknown_0::takeWTF16CodePoint(string_view *str,bool allowWTF)

{
  ushort uVar1;
  ushort *puVar2;
  uint uVar3;
  ulong uVar4;
  ushort *puVar5;
  size_t sVar6;
  uint uVar7;
  
  uVar4 = str->_M_len;
  puVar2 = (ushort *)str->_M_str;
  if (uVar4 < 2) {
    str->_M_len = 0;
    str->_M_str = (char *)((long)puVar2 + uVar4);
    uVar3 = 0;
  }
  else {
    uVar1 = *puVar2;
    str->_M_len = uVar4 - 2;
    str->_M_str = (char *)(puVar2 + 1);
    uVar3 = uVar1 | 0x10000;
  }
  if (uVar3 >> 0x10 != 0) {
    if ((uVar3 & 0xfc00) == 0xd800) {
      uVar4 = str->_M_len;
      puVar2 = (ushort *)str->_M_str;
      if (uVar4 < 2) {
        puVar5 = (ushort *)((long)puVar2 + uVar4);
        sVar6 = 0;
        uVar7 = 0;
      }
      else {
        sVar6 = uVar4 - 2;
        puVar5 = puVar2 + 1;
        uVar7 = *puVar2 | 0x10000;
      }
      if ((uVar7 & 0x1fc00) == 0x1dc00) {
        uVar4 = 0x100000000;
        str->_M_len = sVar6;
        str->_M_str = (char *)puVar5;
        uVar3 = (uVar3 * 0x400 + 0xa00000 & 0x3fffc00) + (uVar7 & 0x3ff) + 0x10000;
        goto LAB_00c3f90b;
      }
      if (allowWTF) goto LAB_00c3f8fe;
    }
    else if ((uVar3 & 0xfc00) != 0xdc00 || allowWTF) {
LAB_00c3f8fe:
      uVar4 = 0x100000000;
      uVar3 = uVar3 & 0xffff;
      goto LAB_00c3f90b;
    }
  }
  uVar4 = 0;
LAB_00c3f90b:
  return (optional<unsigned_int>)(uVar3 | uVar4);
}

Assistant:

std::optional<uint32_t> takeWTF16CodePoint(std::string_view& str,
                                           bool allowWTF = true) {
  auto u = takeWTF16CodeUnit(str);
  if (!u) {
    return std::nullopt;
  }

  if (0xD800 <= *u && *u < 0xDC00) {
    // High surrogate; take the next low surrogate if it exists.
    auto next = str;
    auto low = takeWTF16CodeUnit(next);
    if (low && 0xDC00 <= *low && *low < 0xE000) {
      str = next;
      uint16_t highBits = *u - 0xD800;
      uint16_t lowBits = *low - 0xDC00;
      return 0x10000 + ((highBits << 10) | lowBits);
    } else if (!allowWTF) {
      // Unpaired high surrogate.
      return std::nullopt;
    }
  } else if (!allowWTF && 0xDC00 <= *u && *u < 0xE000) {
    // Unpaired low surrogate.
    return std::nullopt;
  }

  return *u;
}